

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_int csc_copy(CUPDLPcsc *dst,CUPDLPcsc *src)

{
  undefined4 uVar1;
  undefined4 uVar2;
  
  dst->nRows = src->nRows;
  uVar1 = src->nCols;
  uVar2 = src->nMatElem;
  dst->nCols = uVar1;
  dst->nMatElem = uVar2;
  memcpy(dst->colMatBeg,src->colMatBeg,(long)(int)uVar1 * 4 + 4);
  memcpy(dst->colMatIdx,src->colMatIdx,(long)src->nMatElem << 2);
  memcpy(dst->colMatElem,src->colMatElem,(long)src->nMatElem << 3);
  return 0;
}

Assistant:

cupdlp_int csc_copy(CUPDLPcsc *dst, CUPDLPcsc *src) {
  dst->nRows = src->nRows;
  dst->nCols = src->nCols;
  dst->nMatElem = src->nMatElem;
  CUPDLP_COPY_VEC(dst->colMatBeg, src->colMatBeg, cupdlp_int, src->nCols + 1);
  CUPDLP_COPY_VEC(dst->colMatIdx, src->colMatIdx, cupdlp_int, src->nMatElem);
  CUPDLP_COPY_VEC(dst->colMatElem, src->colMatElem, cupdlp_float,
                  src->nMatElem);

#ifndef CUPDLP_CPU
  // Pointer to GPU csc matrix
  CHECK_CUSPARSE(cusparseCreateCsc(
      &dst->cuda_csc, src->nRows, src->nCols, src->nMatElem, dst->colMatBeg,
      dst->colMatIdx, dst->colMatElem, CUSPARSE_INDEX_32I, CUSPARSE_INDEX_32I,
      CUSPARSE_INDEX_BASE_ZERO, CudaComputeType));
#endif

  return 0;
}